

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

string * __thiscall
punky::obj::type_to_string_abi_cxx11_(string *__return_storage_ptr__,obj *this,ObjectType *type)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    __s = "null";
    __a = &local_e;
    break;
  case 1:
    __s = "int";
    __a = &local_9;
    break;
  case 2:
    __s = "boolean";
    __a = &local_a;
    break;
  case 3:
    __s = "return";
    __a = &local_b;
    break;
  case 4:
    __s = "error";
    __a = &local_c;
    break;
  case 5:
    __s = "fn";
    __a = &local_d;
    break;
  case 6:
    __s = "";
    __a = &local_f;
    break;
  default:
    __s = "Default";
    __a = &local_10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const ObjectType& type)
{
    switch (type)
    {
        case ObjectType::Int:
            return "int";

        case ObjectType::Boolean:
            return "boolean";

        case ObjectType::Return:
            return "return";

        case ObjectType::Error:
            return "error";

        case ObjectType::Function:
            return "fn";

        case ObjectType::Null:
            return "null";

        case ObjectType::EmptyOut:
            return "";

        default:
            return "Default";
    }
}